

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

curl_ws_frame * curl_ws_meta(Curl_easy *data)

{
  _Bool _Var1;
  Curl_easy *data_local;
  
  if ((((data == (Curl_easy *)0x0) || (data->magic != 0xc0dedbad)) ||
      (_Var1 = Curl_is_in_callback(data), !_Var1)) ||
     (((data->conn == (connectdata *)0x0 || ((data->conn->proto).ftpc.pp.nread_resp == 0)) ||
      ((*(ulong *)&(data->set).field_0x8ca >> 0x35 & 1) != 0)))) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    data_local = (Curl_easy *)((long)&(((data->conn->proto).tftpc)->remote_addr).buffer + 0x28);
  }
  return (curl_ws_frame *)data_local;
}

Assistant:

curl_ws_frame *curl_ws_meta(struct Curl_easy *data)
{
  /* we only return something for websocket, called from within the callback
     when not using raw mode */
  if(GOOD_EASY_HANDLE(data) && Curl_is_in_callback(data) && data->conn &&
     data->conn->proto.ws && !data->set.ws_raw_mode)
    return &data->conn->proto.ws->frame;
  return NULL;
}